

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.c
# Opt level: O0

cf_int64_t cf_clock_current_ns(cf_clock_t *self)

{
  int iVar1;
  undefined1 local_28 [8];
  timespec ts;
  cf_clock_t *self_local;
  
  ts.tv_nsec = (__syscall_slong_t)self;
  if (((*(uint *)&self->field_0x8 >> 1 & 1) == 0) && ((*(uint *)&self->field_0x8 & 1) == 0)) {
    iVar1 = clock_gettime(0,(timespec *)local_28);
    if (iVar1 == -1) {
      return -1;
    }
  }
  else {
    iVar1 = clock_gettime(1,(timespec *)local_28);
    if (iVar1 == -1) {
      return -1;
    }
  }
  return (long)local_28 * 1000000000 + ts.tv_sec;
}

Assistant:

cf_int64_t cf_clock_current_ns(cf_clock_t* self) {
#ifdef CF_OS_WIN
    // https://docs.microsoft.com/en-us/windows/win32/sysinfo/acquiring-high-resolution-time-stamps
    LARGE_INTEGER clock_result, freq_result;
    ULONGLONG tick_ms;
    if (self->steady_high_flag) {
        if (_G_WIN_QPC_FREQ_ == 0) {
            if (!QueryPerformanceFrequency(&freq_result)) {
                return -1;
            }
            _G_WIN_QPC_FREQ_ = freq_result.QuadPart;
        }
        
        if (!QueryPerformanceCounter(&clock_result)) {
            return -1;
        }
        return 1000000000 * CF_TYPE_CAST(cf_int64_t, clock_result.QuadPart / _G_WIN_QPC_FREQ_);
    } else if (self->steady_flag) {
        tick_ms = GetTickCount64();
        return 1000000 * CF_TYPE_CAST(cf_int64_t, tick_ms);
    } else {
        return -1;
    }
#else
    struct timespec ts;
    if (self->steady_high_flag || self->steady_flag) {
        if (clock_gettime(CLOCK_MONOTONIC, &ts) == -1) {
            return -1;
        }
    } else {
        if (clock_gettime(CLOCK_REALTIME, &ts) == -1) {
            return -1;
        }
    }
    return 1000000000 * CF_TYPE_CAST(cf_int64_t, ts.tv_sec) + ts.tv_nsec;
#endif
}